

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-surface.c
# Opt level: O0

plutovg_surface_t * plutovg_surface_create_uninitialized(int width,int height)

{
  plutovg_surface_t *surface;
  size_t size;
  int height_local;
  int width_local;
  
  if ((width < 0x1000001) && (height < 0x1000001)) {
    _height_local = (plutovg_surface_t *)malloc((long)(width * height * 4) + 0x18);
    if (_height_local == (plutovg_surface_t *)0x0) {
      _height_local = (plutovg_surface_t *)0x0;
    }
    else {
      _height_local->ref_count = 1;
      _height_local->width = width;
      _height_local->height = height;
      _height_local->stride = width << 2;
      _height_local->data = (uchar *)(_height_local + 1);
    }
  }
  else {
    _height_local = (plutovg_surface_t *)0x0;
  }
  return _height_local;
}

Assistant:

static plutovg_surface_t* plutovg_surface_create_uninitialized(int width, int height)
{
    if(width > STBI_MAX_DIMENSIONS || height > STBI_MAX_DIMENSIONS)
        return NULL;
    const size_t size = width * height * 4;
    plutovg_surface_t* surface = malloc(size + sizeof(plutovg_surface_t));
    if(surface == NULL)
        return NULL;
    surface->ref_count = 1;
    surface->width = width;
    surface->height = height;
    surface->stride = width * 4;
    surface->data = (uint8_t*)(surface + 1);
    return surface;
}